

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseName(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  bool local_4e;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar5) {
    local_4e = false;
  }
  else {
    bVar5 = ParseNestedName(in_stack_ffffffffffffffe8.state_);
    if ((bVar5) || (bVar5 = ParseLocalName(in_stack_ffffffffffffffd8), bVar5)) {
      local_4e = true;
    }
    else {
      iVar1 = (in_RDI->parse_state).mangled_idx;
      iVar2 = (in_RDI->parse_state).out_cur_idx;
      iVar3 = (in_RDI->parse_state).prev_name_idx;
      uVar4 = *(undefined4 *)&(in_RDI->parse_state).field_0xc;
      bVar5 = ParseSubstitution((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                  in_stack_fffffffffffffff8),
                                SUB81((ulong)in_RDI >> 0x38,0));
      if ((bVar5) && (bVar5 = ParseTemplateArgs(in_stack_ffffffffffffffe8.state_), bVar5)) {
        local_4e = true;
      }
      else {
        (in_RDI->parse_state).mangled_idx = iVar1;
        (in_RDI->parse_state).out_cur_idx = iVar2;
        (in_RDI->parse_state).prev_name_idx = iVar3;
        *(undefined4 *)&(in_RDI->parse_state).field_0xc = uVar4;
        bVar5 = ParseUnscopedName(in_stack_ffffffffffffffe8.state_);
        local_4e = false;
        if (bVar5) {
          bVar5 = ParseTemplateArgs(in_stack_ffffffffffffffe8.state_);
          local_4e = Optional(bVar5);
        }
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(local_4e & 1);
}

Assistant:

static bool ParseName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseNestedName(state) || ParseLocalName(state)) {
    return true;
  }

  // We reorganize the productions to avoid re-parsing unscoped names.
  // - Inline <unscoped-template-name> productions:
  //   <name> ::= <substitution> <template-args>
  //          ::= <unscoped-name> <template-args>
  //          ::= <unscoped-name>
  // - Merge the two productions that start with unscoped-name:
  //   <name> ::= <unscoped-name> [<template-args>]

  ParseState copy = state->parse_state;
  // "std<...>" isn't a valid name.
  if (ParseSubstitution(state, /*accept_std=*/false) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Note there's no need to restore state after this since only the first
  // subparser can fail.
  return ParseUnscopedName(state) && Optional(ParseTemplateArgs(state));
}